

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

ssize_t __thiscall kj::TestRunner::write(TestRunner *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  ssize_t sVar2;
  StringPtr *params_1;
  char *pcVar3;
  String text;
  undefined6 in_stack_ffffffffffffff80;
  char *local_78;
  undefined8 local_70;
  StringPtr local_68;
  String local_58;
  char local_38 [16];
  StringPtr local_28;
  
  local_78 = "";
  local_70 = 1;
  local_68.content.ptr = "";
  local_68.content.size_ = 1;
  if (this->useColor != true) goto LAB_0026fdb6;
  if (__fd == 2) {
    local_78 = "\x1b[0;1;34m";
LAB_0026fd93:
    local_70 = 10;
  }
  else {
    if (__fd == 1) {
      local_78 = "\x1b[0;1;32m";
      goto LAB_0026fd93;
    }
    if (__fd == 0) {
      local_78 = "\x1b[0;1;31m";
      goto LAB_0026fd93;
    }
  }
  local_68.content.ptr = "\x1b[0m";
  local_68.content.size_ = 5;
LAB_0026fdb6:
  params_1 = &local_68;
  local_28.content.ptr = (char *)__buf;
  local_28.content.size_ = __n;
  str<kj::StringPtr&,kj::StringPtr&,kj::StringPtr&,char,kj::StringPtr&,char>
            (&local_58,(kj *)&local_78,&local_28,params_1,(StringPtr *)&stack0xffffffffffffff87,
             local_38,(StringPtr *)&stack0xffffffffffffff86,
             (char *)CONCAT17(0x20,CONCAT16(10,in_stack_ffffffffffffff80)));
  pcVar3 = "";
  if (local_58.content.size_ != 0) {
    pcVar3 = local_58.content.ptr;
  }
  sVar2 = write(this,(int)pcVar3,(void *)(local_58.content.size_ + (local_58.content.size_ == 0)),
                (size_t)params_1);
  sVar1 = local_58.content.size_;
  pcVar3 = local_58.content.ptr;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    sVar2 = (*(code *)**(undefined8 **)local_58.content.disposer)
                      (local_58.content.disposer,pcVar3,1,sVar1,sVar1,0);
  }
  return sVar2;
}

Assistant:

void write(Color color, StringPtr prefix, StringPtr message) {
    StringPtr startColor, endColor;
    if (useColor) {
      switch (color) {
        case RED:   startColor = "\033[0;1;31m"; break;
        case GREEN: startColor = "\033[0;1;32m"; break;
        case BLUE:  startColor = "\033[0;1;34m"; break;
      }
      endColor = "\033[0m";
    }

    String text = kj::str(startColor, prefix, endColor, ' ', message, '\n');
    write(text);
  }